

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::setDocumentMode(QMainWindowLayout *this,bool enabled)

{
  Span *pSVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  piter local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this[0x710] != (QMainWindowLayout)enabled) {
    this[0x710] = (QMainWindowLayout)enabled;
    local_38 = (piter)QHash<QTabBar_*,_QHashDummyValue>::begin
                                ((QHash<QTabBar_*,_QHashDummyValue> *)(this + 0x718));
    while( true ) {
      if (local_38.d == (Data<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *)0x0 &&
          local_38.bucket == 0) break;
      pSVar1 = (local_38.d)->spans;
      uVar4 = local_38.bucket >> 7;
      QTabBar::setDocumentMode
                (*(QTabBar **)
                  pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)local_38.bucket & 0x7f]].storage
                  .data,(bool)this[0x710]);
      QHashPrivate::iterator<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_>::operator++(&local_38)
      ;
    }
    lVar2 = *(long *)(this + 0x728);
    lVar3 = *(long *)(this + 0x730);
    for (lVar5 = 0; lVar3 << 3 != lVar5; lVar5 = lVar5 + 8) {
      QTabBar::setDocumentMode(*(QTabBar **)(lVar2 + lVar5),(bool)this[0x710]);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::setDocumentMode(bool enabled)
{
    if (_documentMode == enabled)
        return;

    _documentMode = enabled;

    // Update the document mode for all tab bars
    for (QTabBar *bar : std::as_const(usedTabBars))
        bar->setDocumentMode(_documentMode);
    for (QTabBar *bar : std::as_const(unusedTabBars))
        bar->setDocumentMode(_documentMode);
}